

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O0

double MatDet(double *A,int row)

{
  int *list_00;
  double dVar1;
  double Out;
  int i;
  int *list;
  int row_local;
  double *A_local;
  
  list_00 = (int *)malloc((long)row << 2);
  for (Out._4_4_ = 0; Out._4_4_ < row; Out._4_4_ = Out._4_4_ + 1) {
    list_00[Out._4_4_] = Out._4_4_;
  }
  dVar1 = det(A,row,0,list_00,0.0);
  free(list_00);
  return dVar1;
}

Assistant:

double MatDet(double *A, int row) {
    int *list = (int *) malloc(sizeof(int) * row);
    for (int i = 0; i < row; i++)
        list[i] = i;
    double Out = det(A, row, 0, list, 0.0);
    free(list);
    return Out;
}